

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsfil.cpp
# Opt level: O3

int __thiscall CTcSymObjBase::write_refs_to_obj_file(CTcSymObjBase *this,CVmFile *fp)

{
  long lVar1;
  long lVar2;
  uint32_t tmp;
  long lVar3;
  CTcSymbol *pCVar4;
  long lVar5;
  uint16_t tmp_2;
  int iVar6;
  CTPNSuperclass *this_00;
  uint16_t tmp_3;
  CTcVocabEntry *pCVar7;
  char b [4];
  char local_34 [4];
  
  iVar6 = 0;
  if ((this->field_0xb8 & 0x40) != 0) {
    CVmFile::write_bytes(fp,local_34,4);
    lVar3 = ftell((FILE *)fp->fp_);
    lVar1 = fp->seek_base_;
    CVmFile::write_bytes(fp,local_34,2);
    if ((this->obj_stm_ != (CTPNStmObject *)0x0) &&
       (this_00 = (this->obj_stm_->super_CTPNStmObjectBase).super_CTPNObjDef.sclist_.head_,
       this_00 != (CTPNSuperclass *)0x0)) {
      do {
        pCVar4 = CTPNSuperclass::get_sym(this_00);
        if ((pCVar4 != (CTcSymbol *)0x0) &&
           (*(int *)&(pCVar4->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.
                     field_0x24 == 2)) {
          CVmFile::write_bytes(fp,local_34,4);
        }
        this_00 = this_00->nxt_;
      } while (this_00 != (CTPNSuperclass *)0x0);
    }
    lVar5 = ftell((FILE *)fp->fp_);
    lVar2 = fp->seek_base_;
    fseek((FILE *)fp->fp_,(lVar3 - lVar1) + lVar2,0);
    CVmFile::write_bytes(fp,local_34,2);
    fseek((FILE *)fp->fp_,(lVar5 - lVar2) + fp->seek_base_,0);
    for (pCVar7 = this->vocab_; pCVar7 != (CTcVocabEntry *)0x0; pCVar7 = pCVar7->nxt_) {
    }
    CVmFile::write_bytes(fp,local_34,2);
    pCVar7 = this->vocab_;
    iVar6 = 1;
    if (pCVar7 != (CTcVocabEntry *)0x0) {
      do {
        CVmFile::write_bytes(fp,local_34,2);
        CVmFile::write_bytes(fp,pCVar7->txt_,pCVar7->len_);
        CVmFile::write_bytes(fp,local_34,2);
        pCVar7 = pCVar7->nxt_;
      } while (pCVar7 != (CTcVocabEntry *)0x0);
    }
  }
  return iVar6;
}

Assistant:

int CTcSymObjBase::write_refs_to_obj_file(CVmFile *fp)
{
    CTPNSuperclass *sc;
    uint cnt;
    long cnt_pos;
    long end_pos;
    CTcVocabEntry *voc;

    /* 
     *   if this symbol wasn't written to the object file in the first place,
     *   we obviously don't want to include any extra data for it 
     */
    if (!written_to_obj_)
        return FALSE;

    /* write my symbol index */
    fp->write_uint4(get_obj_file_idx());

    /* write a placeholder superclass count */
    cnt_pos = fp->get_pos();
    fp->write_uint2(0);

    /* write my superclass list */
    for (sc = (obj_stm_ != 0 ? obj_stm_->get_first_sc() : 0), cnt = 0 ;
         sc != 0 ; sc = sc->nxt_)
    {
        CTcSymObj *sym;

        /* look up this superclass symbol */
        sym = (CTcSymObj *)sc->get_sym();
        if (sym != 0 && sym->get_type() == TC_SYM_OBJ)
        {
            /* write the superclass symbol index */
            fp->write_uint4(sym->get_obj_file_idx());

            /* count it */
            ++cnt;
        }
    }

    /* go back and write the superclass count */
    end_pos = fp->get_pos();
    fp->set_pos(cnt_pos);
    fp->write_uint2(cnt);
    fp->set_pos(end_pos);

    /* count my vocabulary words */
    for (cnt = 0, voc = vocab_ ; voc != 0 ; ++cnt, voc = voc->nxt_) ;

    /* write my vocabulary words */
    fp->write_uint2(cnt);
    for (voc = vocab_ ; voc != 0 ; voc = voc->nxt_)
    {
        /* write the text of the word */
        fp->write_uint2(voc->len_);
        fp->write_bytes(voc->txt_, voc->len_);

        /* write the property ID */
        fp->write_uint2(voc->prop_);
    }

    /* indicate that we wrote the symbol */
    return TRUE;
}